

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::RunContext::runCurrentTest(RunContext *this,string *redirectedCout,string *redirectedCerr)

{
  bool bVar1;
  uint uVar2;
  IStreamingReporter *pIVar3;
  SourceLineInfo *_lineInfo;
  TestCaseTracker *tracker;
  pointer pUVar4;
  pointer pUVar5;
  pointer pUVar6;
  Counts CVar7;
  undefined1 local_888 [8];
  SectionStats testCaseSectionStats;
  undefined1 auStack_7f0 [7];
  bool missingAssertions;
  Counts assertions;
  __normal_iterator<const_Catch::RunContext::UnfinishedSections_*,_std::vector<Catch::RunContext::UnfinishedSections,_std::allocator<Catch::RunContext::UnfinishedSections>_>_>
  local_7d8;
  const_iterator itEnd;
  __normal_iterator<const_Catch::RunContext::UnfinishedSections_*,_std::vector<Catch::RunContext::UnfinishedSections,_std::allocator<Catch::RunContext::UnfinishedSections>_>_>
  local_7c8;
  const_iterator it;
  TestFailureException *anon_var_0;
  ExpressionResultBuilder exResult;
  StreamRedirect cerrRedir;
  StreamRedirect coutRedir;
  Timer local_190;
  Timer timer;
  Guard guard;
  string local_178 [39];
  allocator local_151;
  string local_150 [32];
  AssertionInfo local_130;
  double local_c0;
  double duration;
  Counts prevAssertions;
  undefined1 local_90 [8];
  SectionInfo testCaseSection;
  TestCaseInfo *testCaseInfo;
  string *redirectedCerr_local;
  string *redirectedCout_local;
  RunContext *this_local;
  
  testCaseSection.lineInfo.line = (size_t)TestCase::getTestCaseInfo(this->m_activeTestCase);
  SectionInfo::SectionInfo
            ((SectionInfo *)local_90,(string *)testCaseSection.lineInfo.line,
             &((TestCaseInfo *)testCaseSection.lineInfo.line)->description,
             &((TestCaseInfo *)testCaseSection.lineInfo.line)->lineInfo);
  pIVar3 = Ptr<Catch::IStreamingReporter>::operator->(&this->m_reporter);
  (*(pIVar3->super_IShared).super_NonCopyable._vptr_NonCopyable[9])(pIVar3,(SectionInfo *)local_90);
  duration = (double)(this->m_totals).assertions.passed;
  prevAssertions.passed = (this->m_totals).assertions.failed;
  local_c0 = 0.0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_150,"TEST_CASE",&local_151);
  _lineInfo = (SourceLineInfo *)(testCaseSection.lineInfo.line + 0xb0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_178,"",(allocator *)((long)&guard.m_tracker + 7));
  AssertionInfo::AssertionInfo(&local_130,(string *)local_150,_lineInfo,(string *)local_178,Normal);
  AssertionInfo::operator=(&this->m_lastAssertionInfo,&local_130);
  AssertionInfo::~AssertionInfo(&local_130);
  std::__cxx11::string::~string(local_178);
  std::allocator<char>::~allocator((allocator<char> *)((long)&guard.m_tracker + 7));
  std::__cxx11::string::~string(local_150);
  std::allocator<char>::~allocator((allocator<char> *)&local_151);
  tracker = Option<Catch::SectionTracking::TestCaseTracker>::operator*(&this->m_testCaseTracker);
  SectionTracking::TestCaseTracker::Guard::Guard((Guard *)&timer,tracker);
  Timer::Timer(&local_190);
  Timer::start(&local_190);
  pIVar3 = Ptr<Catch::IStreamingReporter>::operator->(&this->m_reporter);
  uVar2 = (*(pIVar3->super_IShared).super_NonCopyable._vptr_NonCopyable[4])();
  if ((uVar2 & 1) == 0) {
    TestCase::invoke(this->m_activeTestCase);
  }
  else {
    StreamRedirect::StreamRedirect
              ((StreamRedirect *)&cerrRedir.m_targetString,(ostream *)&std::cout,redirectedCout);
    StreamRedirect::StreamRedirect
              ((StreamRedirect *)&exResult.field_0x220,(ostream *)&std::cerr,redirectedCerr);
    TestCase::invoke(this->m_activeTestCase);
    StreamRedirect::~StreamRedirect((StreamRedirect *)&exResult.field_0x220);
    StreamRedirect::~StreamRedirect((StreamRedirect *)&cerrRedir.m_targetString);
  }
  local_c0 = Timer::getElapsedSeconds(&local_190);
  SectionTracking::TestCaseTracker::Guard::~Guard((Guard *)&timer);
  itEnd._M_current =
       (UnfinishedSections *)
       std::
       vector<Catch::RunContext::UnfinishedSections,_std::allocator<Catch::RunContext::UnfinishedSections>_>
       ::begin(&this->m_unfinishedSections);
  __gnu_cxx::
  __normal_iterator<Catch::RunContext::UnfinishedSections_const*,std::vector<Catch::RunContext::UnfinishedSections,std::allocator<Catch::RunContext::UnfinishedSections>>>
  ::__normal_iterator<Catch::RunContext::UnfinishedSections*>
            ((__normal_iterator<Catch::RunContext::UnfinishedSections_const*,std::vector<Catch::RunContext::UnfinishedSections,std::allocator<Catch::RunContext::UnfinishedSections>>>
              *)&local_7c8,
             (__normal_iterator<Catch::RunContext::UnfinishedSections_*,_std::vector<Catch::RunContext::UnfinishedSections,_std::allocator<Catch::RunContext::UnfinishedSections>_>_>
              *)&itEnd);
  assertions.failed =
       (size_t)std::
               vector<Catch::RunContext::UnfinishedSections,_std::allocator<Catch::RunContext::UnfinishedSections>_>
               ::end(&this->m_unfinishedSections);
  __gnu_cxx::
  __normal_iterator<Catch::RunContext::UnfinishedSections_const*,std::vector<Catch::RunContext::UnfinishedSections,std::allocator<Catch::RunContext::UnfinishedSections>>>
  ::__normal_iterator<Catch::RunContext::UnfinishedSections*>
            ((__normal_iterator<Catch::RunContext::UnfinishedSections_const*,std::vector<Catch::RunContext::UnfinishedSections,std::allocator<Catch::RunContext::UnfinishedSections>>>
              *)&local_7d8,
             (__normal_iterator<Catch::RunContext::UnfinishedSections_*,_std::vector<Catch::RunContext::UnfinishedSections,_std::allocator<Catch::RunContext::UnfinishedSections>_>_>
              *)&assertions.failed);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&local_7c8,&local_7d8);
    if (!bVar1) break;
    pUVar4 = __gnu_cxx::
             __normal_iterator<const_Catch::RunContext::UnfinishedSections_*,_std::vector<Catch::RunContext::UnfinishedSections,_std::allocator<Catch::RunContext::UnfinishedSections>_>_>
             ::operator->(&local_7c8);
    pUVar5 = __gnu_cxx::
             __normal_iterator<const_Catch::RunContext::UnfinishedSections_*,_std::vector<Catch::RunContext::UnfinishedSections,_std::allocator<Catch::RunContext::UnfinishedSections>_>_>
             ::operator->(&local_7c8);
    pUVar6 = __gnu_cxx::
             __normal_iterator<const_Catch::RunContext::UnfinishedSections_*,_std::vector<Catch::RunContext::UnfinishedSections,_std::allocator<Catch::RunContext::UnfinishedSections>_>_>
             ::operator->(&local_7c8);
    (*(this->super_IResultCapture)._vptr_IResultCapture[4])
              (SUB84(pUVar6->durationInSeconds,0),this,pUVar4,&pUVar5->prevAssertions);
    __gnu_cxx::
    __normal_iterator<const_Catch::RunContext::UnfinishedSections_*,_std::vector<Catch::RunContext::UnfinishedSections,_std::allocator<Catch::RunContext::UnfinishedSections>_>_>
    ::operator++(&local_7c8);
  }
  std::
  vector<Catch::RunContext::UnfinishedSections,_std::allocator<Catch::RunContext::UnfinishedSections>_>
  ::clear(&this->m_unfinishedSections);
  std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>::clear(&this->m_messages);
  CVar7 = Counts::operator-(&(this->m_totals).assertions,(Counts *)&duration);
  assertions.passed = CVar7.failed;
  _auStack_7f0 = CVar7.passed;
  testCaseSectionStats._143_1_ = testForMissingAssertions(this,(Counts *)auStack_7f0);
  SectionStats::SectionStats
            ((SectionStats *)local_888,(SectionInfo *)local_90,(Counts *)auStack_7f0,local_c0,
             (bool)testCaseSectionStats._143_1_);
  pIVar3 = Ptr<Catch::IStreamingReporter>::operator->(&this->m_reporter);
  (*(pIVar3->super_IShared).super_NonCopyable._vptr_NonCopyable[0xc])(pIVar3,local_888);
  SectionStats::~SectionStats((SectionStats *)local_888);
  SectionInfo::~SectionInfo((SectionInfo *)local_90);
  return;
}

Assistant:

void runCurrentTest( std::string& redirectedCout, std::string& redirectedCerr ) {
            TestCaseInfo const& testCaseInfo = m_activeTestCase->getTestCaseInfo();
            SectionInfo testCaseSection( testCaseInfo.name, testCaseInfo.description, testCaseInfo.lineInfo );
            m_reporter->sectionStarting( testCaseSection );
            Counts prevAssertions = m_totals.assertions;
            double duration = 0;
            try {
                m_lastAssertionInfo = AssertionInfo( "TEST_CASE", testCaseInfo.lineInfo, "", ResultDisposition::Normal );
                TestCaseTracker::Guard guard( *m_testCaseTracker );

                Timer timer;
                timer.start();
                if( m_reporter->getPreferences().shouldRedirectStdOut ) {
                    StreamRedirect coutRedir( std::cout, redirectedCout );
                    StreamRedirect cerrRedir( std::cerr, redirectedCerr );
                    m_activeTestCase->invoke();
                }
                else {
                    m_activeTestCase->invoke();
                }
                duration = timer.getElapsedSeconds();
            }
            catch( TestFailureException& ) {
                // This just means the test was aborted due to failure
            }
            catch(...) {
                ExpressionResultBuilder exResult( ResultWas::ThrewException );
                exResult << translateActiveException();
                actOnCurrentResult( exResult.buildResult( m_lastAssertionInfo )  );
            }
            // If sections ended prematurely due to an exception we stored their
            // infos here so we can tear them down outside the unwind process.
            for( std::vector<UnfinishedSections>::const_iterator it = m_unfinishedSections.begin(),
                        itEnd = m_unfinishedSections.end();
                    it != itEnd;
                    ++it )
                sectionEnded( it->info, it->prevAssertions, it->durationInSeconds );
            m_unfinishedSections.clear();
            m_messages.clear();

            Counts assertions = m_totals.assertions - prevAssertions;
            bool missingAssertions = testForMissingAssertions( assertions );

            SectionStats testCaseSectionStats( testCaseSection, assertions, duration, missingAssertions );
            m_reporter->sectionEnded( testCaseSectionStats );
        }